

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitInvoke(RegSlot location,RegSlot callObjLocation,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,RegSlot arg1Location)

{
  ByteCodeWriter *this;
  bool bVar1;
  uint16 callSiteId;
  
  EmitMethodFld(false,false,location,callObjLocation,propertyId,byteCodeGenerator,funcInfo,true);
  FuncInfo::StartRecordingOutArgs(funcInfo,2);
  this = &byteCodeGenerator->m_writer;
  bVar1 = Js::ByteCodeWriter::ShouldIncrementCallSiteId(this,CallI);
  if ((bVar1) && (callSiteId = byteCodeGenerator->m_callSiteId, callSiteId != 0xffff)) {
    byteCodeGenerator->m_callSiteId = callSiteId + 1;
  }
  else {
    callSiteId = byteCodeGenerator->m_callSiteId;
  }
  Js::ByteCodeWriter::StartCall(this,StartCall,2);
  if (callObjLocation != 0xffffffff) {
    Js::ByteCodeWriter::ArgOut<true>(this,0,callObjLocation,callSiteId,false);
  }
  Js::ByteCodeWriter::ArgOut<true>(this,1,arg1Location,callSiteId,false);
  Js::ByteCodeWriter::CallI(this,CallI,location,location,2,callSiteId,CallFlags_None);
  return;
}

Assistant:

void EmitInvoke(
    Js::RegSlot location,
    Js::RegSlot callObjLocation,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo,
    Js::RegSlot arg1Location)
{
    EmitMethodFld(false, false, location, callObjLocation, propertyId, byteCodeGenerator, funcInfo);

    funcInfo->StartRecordingOutArgs(2);

    Js::ProfileId callSiteId = byteCodeGenerator->GetNextCallSiteId(Js::OpCode::CallI);

    byteCodeGenerator->Writer()->StartCall(Js::OpCode::StartCall, 2);
    EmitArgListStart(callObjLocation, byteCodeGenerator, funcInfo, callSiteId);
    byteCodeGenerator->Writer()->ArgOut<true>(1, arg1Location, callSiteId, false /*emitProfiledArgout*/);

    byteCodeGenerator->Writer()->CallI(Js::OpCode::CallI, location, location, 2, callSiteId);
}